

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsets.hpp
# Opt level: O0

iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsets<std::initializer_list<int>&,std::greater<void>>
          (iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this,undefined8 param_3,
          subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          *param_4)

{
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_120;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_e8;
  undefined1 local_98 [8];
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  end;
  undefined1 local_58 [8];
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  begin;
  initializer_list<int> *range_local;
  
  begin._48_8_ = this;
  make_subset_iterator<std::initializer_list<int>&,std::greater<void>>((burst *)local_58,this);
  make_subset_iterator<int_const*,std::greater<void>>(local_98,(burst *)local_58);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::subset_iterator(&local_e8,
                    (subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                     *)local_58);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::subset_iterator(&local_120,
                    (subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                     *)local_98);
  boost::
  make_iterator_range<burst::subset_iterator<int_const*,std::greater<void>,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_e8,&local_120,param_4);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::~subset_iterator(&local_120);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::~subset_iterator(&local_e8);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::~subset_iterator((subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                      *)local_98);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::~subset_iterator((subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                      *)local_58);
  return __return_storage_ptr__;
}

Assistant:

auto subsets (ForwardRange && range, Compare compare)
    {
        auto begin = make_subset_iterator(std::forward<ForwardRange>(range), compare);
        auto end = make_subset_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }